

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManPrintInit(Of_Man_t *p)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)(p->pPars->nRoundsEla + p->pPars->nRounds));
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    if (p->pPars->fCutMin != 0) {
      printf("Funcs = %d  ",(ulong)(uint)p->vTtMem->nEntries);
    }
    piVar1 = p->pGia->pSibls;
    uVar4 = 0;
    if ((piVar1 != (int *)0x0) && (lVar2 = (long)p->pGia->nObjs, uVar4 = 0, 0 < lVar2)) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + (0 < piVar1[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    if (uVar4 != 0) {
      printf("Choices = %d  ",(ulong)uVar4);
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Of_ManPrintInit( Of_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds + p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    if ( p->pPars->fCutMin )
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}